

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decNumber.cpp
# Opt level: O0

decNumber * uprv_decNumberNextMinus_63(decNumber *res,decNumber *rhs,decContext *set)

{
  uint32_t local_54;
  undefined1 auStack_50 [4];
  uint32_t status;
  decContext workset;
  decNumber dtiny;
  decContext *set_local;
  decNumber *rhs_local;
  decNumber *res_local;
  
  auStack_50 = set->digits;
  unique0x00012004 = set->emax;
  workset.digits = set->emin;
  workset.emax = set->round;
  workset.emin = set->traps;
  workset.round = set->status;
  workset.traps = *(uint32_t *)&set->clamp;
  local_54 = 0;
  if ((rhs->bits & 0xc0) == 0x40) {
    decSetMaxValue(res,set);
  }
  else {
    uprv_decNumberZero_63((decNumber *)&workset.status);
    workset.clamp = '\0';
    workset._25_3_ = 0xc46536;
    workset.emax = 6;
    decAddOp(res,rhs,(decNumber *)&workset.status,(decContext *)auStack_50,0x80,&local_54);
    local_54 = local_54 & 0x40000080;
    if (local_54 != 0) {
      decStatus(res,local_54,set);
    }
  }
  return res;
}

Assistant:

U_CAPI decNumber * U_EXPORT2 uprv_decNumberNextMinus(decNumber *res, const decNumber *rhs,
                               decContext *set) {
  decNumber dtiny;                           /* constant  */
  decContext workset=*set;                   /* work  */
  uInt status=0;                             /* accumulator  */
  #if DECCHECK
  if (decCheckOperands(res, DECUNUSED, rhs, set)) return res;
  #endif

  /* +Infinity is the special case  */
  if ((rhs->bits&(DECINF|DECNEG))==DECINF) {
    decSetMaxValue(res, set);                /* is +ve  */
    /* there is no status to set  */
    return res;
    }
  uprv_decNumberZero(&dtiny);                     /* start with 0  */
  dtiny.lsu[0]=1;                            /* make number that is ..  */
  dtiny.exponent=DEC_MIN_EMIN-1;             /* .. smaller than tiniest  */
  workset.round=DEC_ROUND_FLOOR;
  decAddOp(res, rhs, &dtiny, &workset, DECNEG, &status);
  status&=DEC_Invalid_operation|DEC_sNaN;    /* only sNaN Invalid please  */
  if (status!=0) decStatus(res, status, set);
  return res;
  }